

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

bool __thiscall QProcessPrivate::openChannelsForDetached(QProcessPrivate *this)

{
  ProcessChannelType PVar1;
  bool bVar2;
  
  PVar1 = (this->stdinChannel).type;
  if ((PVar1 != Normal) &&
     (((PVar1 & ~PipeSource) != PipeSink || (this->inputChannelMode == '\x01')))) {
    openChannelsForDetached();
  }
  if ((PVar1 & ~PipeSource) == PipeSink) {
    bVar2 = openChannel(this,&this->stdinChannel);
    if (bVar2) goto LAB_00429f24;
LAB_00429faa:
    bVar2 = false;
  }
  else {
LAB_00429f24:
    PVar1 = (this->stdoutChannel).type;
    if (PVar1 != Normal) {
      if (((PVar1 != Redirect) && (PVar1 != PipeSource)) || ((this->processChannelMode & 0xfe) == 2)
         ) {
        openChannelsForDetached();
      }
      if ((PVar1 | PipeSink) == Redirect) {
        bVar2 = openChannel(this,&this->stdoutChannel);
        if (!bVar2) goto LAB_00429faa;
      }
    }
    PVar1 = (this->stderrChannel).type;
    if ((PVar1 != Normal) &&
       ((PVar1 != Redirect ||
        ((this->processChannelMode < 5 && ((0x16U >> (this->processChannelMode & 0x1f) & 1) != 0))))
       )) {
      openChannelsForDetached();
    }
    if (PVar1 == Redirect) {
      bVar2 = openChannel(this,&this->stderrChannel);
      if (!bVar2) goto LAB_00429faa;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool QProcessPrivate::openChannelsForDetached()
{
    // stdin channel.
    bool needToOpen = (stdinChannel.type == Channel::Redirect
                       || stdinChannel.type == Channel::PipeSink);
    if (stdinChannel.type != Channel::Normal
            && (!needToOpen
                || inputChannelMode == QProcess::ForwardedInputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdin channel configuration");
    }
    if (needToOpen && !openChannel(stdinChannel))
        return false;

    // stdout channel.
    needToOpen = (stdoutChannel.type == Channel::Redirect
                  || stdoutChannel.type == Channel::PipeSource);
    if (stdoutChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedOutputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdout channel configuration");
    }
    if (needToOpen && !openChannel(stdoutChannel))
        return false;

    // stderr channel.
    needToOpen = (stderrChannel.type == Channel::Redirect);
    if (stderrChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedErrorChannel
                || processChannelMode == QProcess::MergedChannels)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stderr channel configuration");
    }
    if (needToOpen && !openChannel(stderrChannel))
        return false;

    return true;
}